

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene_bsp.cpp
# Opt level: O0

void __thiscall
QGraphicsSceneBspTree::initialize(QGraphicsSceneBspTree *this,QRectF *rect,int depth)

{
  anon_union_8_2_82aba17e_for_Node_0 aVar1;
  qsizetype qVar2;
  Node *pNVar3;
  parameter_type in_RSI;
  QList<QGraphicsSceneBspTree::Node> *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000008;
  int in_stack_00000018;
  int in_stack_0000001c;
  QRectF *in_stack_00000020;
  QGraphicsSceneBspTree *in_stack_00000028;
  qsizetype in_stack_ffffffffffffff88;
  QList<QGraphicsSceneBspTree::Node> *in_stack_ffffffffffffff90;
  QList<QGraphicsSceneBspTree::Node> *this_00;
  QList<QList<QGraphicsItem_*>_> *this_01;
  qsizetype newSize;
  
  newSize = *(qsizetype *)(in_FS_OFFSET + 0x28);
  aVar1 = in_RSI->field_0;
  qVar2 = *(qsizetype *)&in_RSI->type;
  pNVar3 = *(Node **)&in_RSI[1].type;
  in_RDI[3].d.d = (Data *)in_RSI[1].field_0;
  in_RDI[3].d.ptr = pNVar3;
  in_RDI[2].d.ptr = (Node *)aVar1;
  in_RDI[2].d.size = qVar2;
  *(undefined4 *)&in_RDI[2].d.d = 0;
  this_00 = in_RDI;
  QList<QGraphicsSceneBspTree::Node>::resize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  QList<QGraphicsSceneBspTree::Node>::fill(this_00,in_RSI,newSize);
  QList<QList<QGraphicsItem_*>_>::resize
            ((QList<QList<QGraphicsItem_*>_> *)(in_RDI + 1),in_stack_ffffffffffffff88);
  this_01 = (QList<QList<QGraphicsItem_*>_> *)0x0;
  QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0xa17bdd);
  QList<QList<QGraphicsItem_*>_>::fill(this_01,(parameter_type)this_00,in_stack_00000008);
  QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0xa17bfb);
  initialize(in_stack_00000028,in_stack_00000020,in_stack_0000001c,in_stack_00000018);
  if (*(long *)(in_FS_OFFSET + 0x28) == newSize) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsSceneBspTree::initialize(const QRectF &rect, int depth)
{
    this->rect = rect;
    leafCnt = 0;
    nodes.resize((1 << (depth + 1)) - 1);
    nodes.fill(Node());
    leaves.resize(1ll << depth);
    leaves.fill(QList<QGraphicsItem *>());

    initialize(rect, depth, 0);
}